

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O2

void draw_cells(double *draw_points,int num_draw_points,string *str)

{
  ulong uVar1;
  ulong uVar2;
  CreateDxf Draw;
  CreateDxf local_29;
  
  CreateDxf::CreateDxf(&local_29);
  CreateDxf::DxfBegin(&local_29,str);
  uVar1 = 0;
  uVar2 = (ulong)(uint)num_draw_points;
  if (num_draw_points < 1) {
    uVar2 = uVar1;
  }
  for (; uVar2 * 0x30 - uVar1 != 0; uVar1 = uVar1 + 0x30) {
    CreateDxf::line(&local_29,(float)*(double *)((long)draw_points + uVar1),
                    (float)*(double *)((long)draw_points + uVar1 + 8),
                    (float)*(double *)((long)draw_points + uVar1 + 0x10),
                    (float)*(double *)((long)draw_points + uVar1 + 0x18),
                    (float)*(double *)((long)draw_points + uVar1 + 0x20),
                    (float)*(double *)((long)draw_points + uVar1 + 0x28),str);
  }
  CreateDxf::DxfEnd(&local_29,str);
  CreateDxf::~CreateDxf(&local_29);
  return;
}

Assistant:

void draw_cells(double *draw_points, int num_draw_points, string &str)
{
	CreateDxf Draw;
	Draw.DxfBegin(str);
	float x1, y1, z1, x2, y2, z2;
	for (int i = 0; i < num_draw_points; i++)
	{
		x1 = draw_points[i * 6];
		y1 = draw_points[i * 6 + 1];
		z1 = draw_points[i * 6 + 2];
		x2 = draw_points[i * 6 + 3];
		y2 = draw_points[i * 6 + 4];
		z2 = draw_points[i * 6 + 5];
		Draw.line(x1, y1, z1, x2, y2, z2, str);
	}
	Draw.DxfEnd(str);
}